

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O3

bool __thiscall
burst::
subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
::equal(subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
        *this,subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
              *that)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if ((this->m_begin)._M_node != (that->m_begin)._M_node) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
                 );
  }
  if ((this->m_end)._M_node == (that->m_end)._M_node) {
    lVar1 = this->m_subsequence_size;
    if (lVar1 == that->m_subsequence_size) {
      if (lVar1 == 0) {
        bVar3 = true;
      }
      else {
        lVar2 = 0;
        do {
          bVar3 = *(long *)((long)&((this->m_subsequence).
                                    super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_node + lVar2) ==
                  *(long *)((long)&((that->m_subsequence).
                                    super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_node + lVar2);
          if (!bVar3) {
            return bVar3;
          }
          bVar4 = lVar1 * 8 + -8 != lVar2;
          lVar2 = lVar2 + 8;
        } while (bVar4);
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                ,0x84,
                "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
               );
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }